

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::LightHandle::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,LightHandle *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  ImageInfiniteLight *this_00;
  uint uVar4;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  uVar3 = (uint)uVar2;
  if (uVar1 >> 0x30 < 5) {
    if (uVar3 < 3) {
      if (uVar3 == 2) {
        DistantLight::SampleLe
                  (__return_storage_ptr__,(DistantLight *)(uVar1 & 0xffffffffffff),u1,u2,lambda,time
                  );
      }
      else {
        PointLight::SampleLe
                  (__return_storage_ptr__,(PointLight *)(uVar1 & 0xffffffffffff),u1,u2,lambda,time);
      }
    }
    else if ((uVar3 & 6) == 2) {
      ProjectionLight::SampleLe
                (__return_storage_ptr__,(ProjectionLight *)(uVar1 & 0xffffffffffff),u1,u2,lambda,
                 time);
    }
    else {
      GoniometricLight::SampleLe
                (__return_storage_ptr__,(GoniometricLight *)(uVar1 & 0xffffffffffff),u1,u2,lambda,
                 time);
    }
  }
  else {
    uVar4 = uVar2 - 4;
    if (uVar4 < 3) {
      if (uVar4 == 2) {
        DiffuseAreaLight::SampleLe
                  (__return_storage_ptr__,(DiffuseAreaLight *)(uVar1 & 0xffffffffffff),u1,u2,lambda,
                   time);
      }
      else {
        SpotLight::SampleLe(__return_storage_ptr__,(SpotLight *)(uVar1 & 0xffffffffffff),u1,u2,
                            lambda,time);
      }
    }
    else {
      this_00 = (ImageInfiniteLight *)(uVar1 & 0xffffffffffff);
      if (uVar3 - 6 < 2) {
        UniformInfiniteLight::SampleLe
                  (__return_storage_ptr__,(UniformInfiniteLight *)this_00,u1,u2,lambda,time);
      }
      else if (uVar3 - 6 == 2) {
        ImageInfiniteLight::SampleLe(__return_storage_ptr__,this_00,u1,u2,lambda,time);
      }
      else {
        PortalImageInfiniteLight::SampleLe
                  (__return_storage_ptr__,(PortalImageInfiniteLight *)this_00,u1,u2,lambda,time);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> LightHandle::SampleLe(Point2f u1, Point2f u2,
                                                    SampledWavelengths &lambda,
                                                    Float time) const {
    auto sample = [&](auto ptr) { return ptr->SampleLe(u1, u2, lambda, time); };
    return Dispatch(sample);
}